

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O3

void IoTHubMessaging_LL_Destroy(IOTHUB_MESSAGING_HANDLE messagingHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGING *messHandle;
  undefined4 local_c;
  
  if (messagingHandle != (IOTHUB_MESSAGING_HANDLE)0x0) {
    local_c = 7;
    iVar1 = singlylinkedlist_remove_if
                      (messagingHandle->send_callback_data,remove_all_send_data_condition_function,
                       &local_c);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"dequeue_all_send_callback_data",0xc2,1,"Failed dequeueing all send_data.");
      }
    }
    messagingHandle->send_queue_size = 0;
    singlylinkedlist_destroy(messagingHandle->send_callback_data);
    free(messagingHandle->hostname);
    free(messagingHandle->iothubName);
    free(messagingHandle->iothubSuffix);
    free(messagingHandle->sharedAccessKey);
    free(messagingHandle->keyName);
    free(messagingHandle->trusted_cert);
    free(messagingHandle);
  }
  return;
}

Assistant:

void IoTHubMessaging_LL_Destroy(IOTHUB_MESSAGING_HANDLE messagingHandle)
{
    if (messagingHandle != NULL)
    {
        IOTHUB_MESSAGING* messHandle = (IOTHUB_MESSAGING*)messagingHandle;

        dequeue_all_send_callback_data(messagingHandle, IOTHUB_MESSAGING_BECAUSE_DESTROY);
        
        singlylinkedlist_destroy(messagingHandle->send_callback_data);
        free(messHandle->hostname);
        free(messHandle->iothubName);
        free(messHandle->iothubSuffix);
        free(messHandle->sharedAccessKey);
        free(messHandle->keyName);
        free(messHandle->trusted_cert);
        free(messHandle);
    }
}